

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.hpp
# Opt level: O0

Uint32 __thiscall
Diligent::PipelineResourceSignatureGLImpl::GetImmutableSamplerIdx
          (PipelineResourceSignatureGLImpl *this,ResourceAttribs *Res)

{
  undefined4 uVar1;
  bool bVar2;
  Uint32 UVar3;
  PipelineResourceDesc *pPVar4;
  Char *pCVar5;
  char (*in_RCX) [77];
  undefined1 local_78 [8];
  string msg_1;
  PipelineResourceAttribsType *SamAttribs;
  undefined1 local_40 [8];
  string msg;
  Uint32 ImtblSamIdx;
  ResourceAttribs *Res_local;
  PipelineResourceSignatureGLImpl *this_local;
  
  msg.field_2._12_4_ = 0xffffffff;
  bVar2 = PipelineResourceAttribsGL::IsImmutableSamplerAssigned(Res);
  if (bVar2) {
    msg.field_2._12_4_ = *(uint *)&Res->field_0x4 & 0x7fffffff;
  }
  else {
    bVar2 = PipelineResourceAttribsGL::IsSamplerAssigned(Res);
    if (bVar2) {
      pPVar4 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceDesc
                         (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                          *(uint *)&Res->field_0x4 & 0x7fffffff);
      if (pPVar4->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
        FormatString<char[26],char[77]>
                  ((string *)local_40,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "GetResourceDesc(Res.SamplerInd).ResourceType == SHADER_RESOURCE_TYPE_SAMPLER",
                   in_RCX);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"GetImmutableSamplerIdx",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/PipelineResourceSignatureGLImpl.hpp"
                   ,0x89);
        std::__cxx11::string::~string((string *)local_40);
      }
      msg_1.field_2._8_8_ =
           PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceAttribs
                     (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                      *(uint *)&Res->field_0x4 & 0x7fffffff);
      bVar2 = PipelineResourceAttribsGL::IsImmutableSamplerAssigned
                        ((PipelineResourceAttribsGL *)msg_1.field_2._8_8_);
      if (bVar2) {
        msg.field_2._12_4_ = *(uint *)(msg_1.field_2._8_8_ + 4) & 0x7fffffff;
      }
    }
  }
  uVar1 = msg.field_2._12_4_;
  if (msg.field_2._12_4_ != -1) {
    UVar3 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetImmutableSamplerCount
                      (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>);
    if (UVar3 <= (uint)uVar1) {
      FormatString<char[26],char[88]>
                ((string *)local_78,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "ImtblSamIdx == InvalidImmutableSamplerIndex || ImtblSamIdx < GetImmutableSamplerCount()"
                 ,(char (*) [88])(ulong)UVar3);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"GetImmutableSamplerIdx",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/PipelineResourceSignatureGLImpl.hpp"
                 ,0x8e);
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  return msg.field_2._12_4_;
}

Assistant:

Uint32 GetImmutableSamplerIdx(const ResourceAttribs& Res) const
    {
        auto ImtblSamIdx = InvalidImmutableSamplerIndex;
        if (Res.IsImmutableSamplerAssigned())
            ImtblSamIdx = Res.SamplerInd;
        else if (Res.IsSamplerAssigned())
        {
            VERIFY_EXPR(GetResourceDesc(Res.SamplerInd).ResourceType == SHADER_RESOURCE_TYPE_SAMPLER);
            const auto& SamAttribs = GetResourceAttribs(Res.SamplerInd);
            if (SamAttribs.IsImmutableSamplerAssigned())
                ImtblSamIdx = SamAttribs.SamplerInd;
        }
        VERIFY_EXPR(ImtblSamIdx == InvalidImmutableSamplerIndex || ImtblSamIdx < GetImmutableSamplerCount());
        return ImtblSamIdx;
    }